

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ostringstream *poVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  size_type sVar5;
  bool bVar6;
  OutputWorker *pOVar7;
  string fileSendPath;
  string fileSendName;
  MyServer server;
  string local_2c0;
  string local_2a0;
  undefined1 local_280 [392];
  MyServer local_f8;
  
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"sendfile.bin","");
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"download.bin","");
  sVar5 = local_2c0._M_string_length;
  if (1 < argc) {
    pcVar4 = argv[1];
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&local_2c0,0,(char *)sVar5,(ulong)pcVar4);
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = (ostringstream *)(local_280 + 0x10);
      local_280._0_8_ = Logger.ChannelName;
      local_280._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Using file send path: ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
      pOVar7 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_280);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_280 + 0x80));
    }
  }
  sVar5 = local_2a0._M_string_length;
  if (2 < argc) {
    pcVar4 = argv[2];
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&local_2a0,0,(char *)sVar5,(ulong)pcVar4);
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = (ostringstream *)(local_280 + 0x10);
      local_280._0_8_ = Logger.ChannelName;
      local_280._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Using file send name: ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
      pOVar7 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_280);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_280 + 0x80));
    }
  }
  tonk::SDKSocket::SDKSocket(&local_f8.super_SDKSocket);
  paVar2 = &local_f8.FileSendPath.field_2;
  local_f8.super_SDKSocket._vptr_SDKSocket = (_func_int **)&PTR__MyServer_0010aaa8;
  local_f8.FileSendPath._M_string_length = 0;
  local_f8.FileSendPath.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_f8.FileSendName.field_2;
  local_f8.FileSendName._M_string_length = 0;
  local_f8.FileSendName.field_2._M_local_buf[0] = '\0';
  local_f8.FileSendPath._M_dataplus._M_p = (pointer)paVar2;
  local_f8.FileSendName._M_dataplus._M_p = (pointer)paVar3;
  bVar6 = MyServer::Initialize(&local_f8,&local_2c0,&local_2a0);
  if (bVar6) {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001044b7;
    poVar1 = (ostringstream *)(local_280 + 0x10);
    local_280._0_8_ = Logger.ChannelName;
    local_280._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"File sending server started on port ",0x24);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,".  Now start the file receiver client to receive a file",0x37);
    pOVar7 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_280);
  }
  else {
    if (1 < (int)Logger.ChannelMinLevel) goto LAB_001044b7;
    poVar1 = (ostringstream *)(local_280 + 0x10);
    local_280._0_8_ = Logger.ChannelName;
    local_280._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"File sending server failed to start",0x23);
    pOVar7 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_280);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 0x10));
  std::ios_base::~ios_base((ios_base *)(local_280 + 0x80));
LAB_001044b7:
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = (ostringstream *)(local_280 + 0x10);
    local_280._0_8_ = Logger.ChannelName;
    local_280._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Press ENTER key to stop the server.",0x23);
    pOVar7 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_280);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_280 + 0x80));
  }
  getchar();
  local_f8.super_SDKSocket._vptr_SDKSocket = (_func_int **)&PTR__MyServer_0010aaa8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.FileSendName._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8.FileSendName._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.FileSendPath._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8.FileSendPath._M_dataplus._M_p);
  }
  tonk::SDKSocket::~SDKSocket(&local_f8.super_SDKSocket);
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = (ostringstream *)(local_280 + 0x10);
    local_280._0_8_ = Logger.ChannelName;
    local_280._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Press ENTER key to terminate.",0x1d);
    pOVar7 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_280);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_280 + 0x80));
  }
  getchar();
  if ((int)Logger.ChannelMinLevel < 2) {
    poVar1 = (ostringstream *)(local_280 + 0x10);
    local_280._0_8_ = Logger.ChannelName;
    local_280._8_4_ = Debug;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"...Key press detected.  Terminating..",0x25);
    pOVar7 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_280);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_280 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    std::string fileSendPath = kFileSendPath, fileSendName = kFileSendName;

    if (argc >= 2) {
        fileSendPath = argv[1];
        Logger.Info("Using file send path: ", fileSendPath);
    }
    if (argc >= 3) {
        fileSendName = argv[2];
        Logger.Info("Using file send name: ", fileSendName);
    }

    {
        MyServer server;

        if (server.Initialize(fileSendPath, fileSendName)) {
            Logger.Debug("File sending server started on port ", kFileSenderServerPort,
                ".  Now start the file receiver client to receive a file");
        }
        else {
            Logger.Debug("File sending server failed to start");
        }

        Logger.Debug("Press ENTER key to stop the server.");

        ::getchar();
    }

    Logger.Debug("Press ENTER key to terminate.");

    ::getchar();

    Logger.Debug("...Key press detected.  Terminating..");

    return 0;
}